

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O2

path * mp::GetExecutablePath(void)

{
  size_t sVar1;
  SystemError *this;
  int *piVar2;
  path *in_RDI;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> buffer;
  
  buffer.super_Buffer<char>.ptr_ = buffer.data_;
  buffer.super_Buffer<char>.size_ = 0;
  buffer.super_Buffer<char>.capacity_ = 500;
  buffer.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_003993e8;
  fmt::Buffer<char>::resize(&buffer.super_Buffer<char>,500);
  while( true ) {
    sVar1 = readlink("/proc/self/exe",buffer.super_Buffer<char>.ptr_,buffer.super_Buffer<char>.size_
                    );
    if ((long)sVar1 < 0) {
      this = (SystemError *)__cxa_allocate_exception(0x18);
      piVar2 = __errno_location();
      fmt::SystemError::SystemError(this,*piVar2,(CStringRef)0x2c4849);
      __cxa_throw(this,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
    }
    if (sVar1 != buffer.super_Buffer<char>.size_) break;
    fmt::Buffer<char>::resize(&buffer.super_Buffer<char>,sVar1 * 2);
  }
  path::path(in_RDI,buffer.super_Buffer<char>.ptr_,buffer.super_Buffer<char>.ptr_ + sVar1);
  fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::~MemoryBuffer(&buffer);
  return in_RDI;
}

Assistant:

path mp::GetExecutablePath() {
  fmt::internal::MemoryBuffer<char, BUFFER_SIZE> buffer;
  buffer.resize(BUFFER_SIZE);
  ssize_t size = 0;
  for (;;) {
    size = readlink("/proc/self/exe", &buffer[0], buffer.size());
    if (size < 0)
      throw SystemError(errno, "cannot get executable path");
    if (static_cast<size_t>(size) != buffer.size()) break;
    buffer.resize(2 * buffer.size());
  }
  const char *s = &buffer[0];
  return path(s, s + size);
}